

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O1

void __thiscall read_wallmark::operator()(read_wallmark *this,wm_object *wm,xr_reader *r)

{
  uint8_t *puVar1;
  float *pfVar2;
  uint *puVar3;
  ulong __n;
  
  puVar1 = (r->field_2).m_p;
  (r->field_2).m_p = puVar1 + 1;
  wm->selected = *puVar1 != '\0';
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  (wm->bbox).field_0.field_1.x1 = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  (wm->bbox).field_0.field_1.y1 = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  (wm->bbox).field_0.field_1.z1 = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  (wm->bbox).field_0.field_1.x2 = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  (wm->bbox).field_0.field_1.y2 = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  (wm->bbox).field_0.field_1.z2 = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  (wm->bsphere).p.field_0.field_0.x = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  (wm->bsphere).p.field_0.field_0.y = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  (wm->bsphere).p.field_0.field_0.z = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  (wm->bsphere).r = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  wm->width = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  wm->height = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  wm->rotate = *pfVar2;
  puVar3 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  __n = (ulong)*puVar3;
  std::vector<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>::reserve(&wm->vertices,__n);
  std::vector<xray_re::wm_vertex,std::allocator<xray_re::wm_vertex>>::
  _M_assign_aux<xray_re::wm_vertex_const*>
            ((vector<xray_re::wm_vertex,std::allocator<xray_re::wm_vertex>> *)&wm->vertices,
             puVar3 + 1,puVar3 + __n * 6 + 1);
  puVar1 = (r->field_2).m_p;
  (r->field_2).m_p = puVar1 + __n * 0x18;
  if (puVar1 + __n * 0x18 <= r->m_end) {
    return;
  }
  __assert_fail("m_p <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                ,0x7c,"void xray_re::xr_reader::advance(size_t)");
}

Assistant:

void operator()(wm_object& wm, xr_reader& r) const {
	wm.selected = r.r_bool();
	r.r_fvector3(wm.bbox.min);
	r.r_fvector3(wm.bbox.max);
	r.r_fvector3(wm.bsphere.p);
	wm.bsphere.r = r.r_float();
	wm.width = r.r_float();
	wm.height = r.r_float();
	wm.rotate = r.r_float();
	r.r_seq(r.r_u32(), wm.vertices);
}